

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_alloc.c
# Opt level: O0

char * string_alloc(string_alloc_t *a_str,size_t length)

{
  string_t *psVar1;
  char *ret;
  string_t *str;
  size_t length_local;
  string_alloc_t *a_str_local;
  
  if (length == 0) {
    a_str_local = (string_alloc_t *)0x0;
  }
  else if ((a_str->nstrings == 0) ||
          (psVar1 = a_str->strings + (a_str->nstrings - 1),
          a_str->max_length <= psVar1->used + length)) {
    if (a_str->max_length < length) {
      a_str->max_length = length;
    }
    psVar1 = new_string_pool(a_str);
    if (psVar1 == (string_t *)0x0) {
      a_str_local = (string_alloc_t *)0x0;
    }
    else {
      psVar1->used = length;
      a_str_local = (string_alloc_t *)psVar1->str;
    }
  }
  else {
    a_str_local = (string_alloc_t *)(psVar1->str + psVar1->used);
    psVar1->used = length + psVar1->used;
  }
  return (char *)a_str_local;
}

Assistant:

char *string_alloc(string_alloc_t *a_str, size_t length) {
    string_t *str;
    char *ret;
    
    if (length <= 0) return NULL;
    
    // add to last string pool if we have space
    if (a_str->nstrings) {
    	str = &a_str->strings[a_str->nstrings - 1];
	
	if (str->used + length < a_str->max_length) {
	    ret = str->str + str->used;
	    str->used += length;
	    return ret;
	}
    }
    
    // increase the max length if needs be
    if (length > a_str->max_length) a_str->max_length = length;
	
    // need a new string pool 
    str = new_string_pool(a_str);
    
    if (NULL == str) return NULL;
    
    str->used = length;
    return str->str;
}